

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathReleaseObject(xmlXPathContextPtr ctxt,xmlXPathObjectPtr obj)

{
  long *plVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  xmlPointerListPtr list;
  int i;
  long lVar5;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) || (plVar1 = (long *)ctxt->cache, plVar1 == (long *)0x0)) {
    xmlXPathFreeObject(obj);
    return;
  }
  switch(obj->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar2 = obj->nodesetval;
    if (pxVar2 == (xmlNodeSetPtr)0x0) {
LAB_001d6082:
      list = (xmlPointerListPtr)plVar1[4];
      if (list == (xmlPointerListPtr)0x0) {
        list = xmlPointerListCreate(0);
        plVar1[4] = (long)list;
        break;
      }
      if ((int)plVar1[7] <= list->number) goto switchD_001d5fc5_caseD_5;
    }
    else {
      if (obj->boolval != 0) {
        obj->type = XPATH_XSLT_TREE;
        xmlXPathFreeValueTree(pxVar2);
LAB_001d607a:
        obj->nodesetval = (xmlNodeSetPtr)0x0;
        goto LAB_001d6082;
      }
      if (0x28 < pxVar2->nodeMax) {
LAB_001d6075:
        xmlXPathFreeNodeSet(pxVar2);
        goto LAB_001d607a;
      }
      list = (xmlPointerListPtr)*plVar1;
      if (list == (xmlPointerListPtr)0x0) {
        list = xmlPointerListCreate((int)pxVar2);
        *plVar1 = (long)list;
        if (list == (xmlPointerListPtr)0x0) goto switchD_001d5fc5_caseD_5;
      }
      else if ((int)plVar1[5] <= list->number) goto LAB_001d6075;
    }
    goto LAB_001d60d8;
  case XPATH_BOOLEAN:
    list = (xmlPointerListPtr)plVar1[2];
    if (list != (xmlPointerListPtr)0x0) {
      if (list->number < (int)plVar1[6]) goto LAB_001d60d8;
      goto LAB_001d6082;
    }
    list = xmlPointerListCreate(0);
    plVar1[2] = (long)list;
    break;
  case XPATH_NUMBER:
    list = (xmlPointerListPtr)plVar1[3];
    if (list != (xmlPointerListPtr)0x0) {
      if (list->number < *(int *)((long)plVar1 + 0x34)) goto LAB_001d60d8;
      goto LAB_001d6082;
    }
    list = xmlPointerListCreate(0);
    plVar1[3] = (long)list;
    break;
  case XPATH_STRING:
    if (obj->stringval != (xmlChar *)0x0) {
      (*xmlFree)(obj->stringval);
    }
    list = (xmlPointerListPtr)plVar1[1];
    if (list != (xmlPointerListPtr)0x0) {
      if (list->number < *(int *)((long)plVar1 + 0x2c)) goto LAB_001d60d8;
      goto LAB_001d6082;
    }
    list = xmlPointerListCreate(0);
    plVar1[1] = (long)list;
    break;
  default:
    goto switchD_001d5fc5_caseD_5;
  }
  if (list != (xmlPointerListPtr)0x0) {
LAB_001d60d8:
    iVar4 = xmlPointerListAddSize(list,obj,0);
    if (iVar4 != -1) {
      pxVar2 = obj->nodesetval;
      if (pxVar2 == (xmlNodeSetPtr)0x0) {
        *(undefined8 *)&obj->index = 0;
        obj->user2 = (void *)0x0;
        obj->stringval = (xmlChar *)0x0;
        obj->user = (void *)0x0;
        *(undefined8 *)&obj->boolval = 0;
        obj->floatval = 0.0;
        *(undefined8 *)obj = 0;
        obj->nodesetval = (xmlNodeSetPtr)0x0;
        *(undefined8 *)&obj->index2 = 0;
      }
      else {
        iVar4 = pxVar2->nodeNr;
        if (iVar4 < 2) {
          if (((iVar4 == 1) && (pxVar3 = *pxVar2->nodeTab, pxVar3 != (xmlNodePtr)0x0)) &&
             (pxVar3->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar3);
          }
        }
        else {
          lVar5 = 0;
          do {
            pxVar3 = pxVar2->nodeTab[lVar5];
            if ((pxVar3 != (xmlNodePtr)0x0) && (pxVar3->type == XML_NAMESPACE_DECL)) {
              xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar3);
              iVar4 = pxVar2->nodeNr;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar4);
        }
        pxVar2->nodeNr = 0;
        *(undefined8 *)obj = 0;
        obj->nodesetval = (xmlNodeSetPtr)0x0;
        *(undefined8 *)&obj->index = 0;
        obj->user2 = (void *)0x0;
        obj->stringval = (xmlChar *)0x0;
        obj->user = (void *)0x0;
        *(undefined8 *)&obj->boolval = 0;
        obj->floatval = 0.0;
        *(undefined8 *)&obj->index2 = 0;
        obj->nodesetval = pxVar2;
      }
      return;
    }
  }
switchD_001d5fc5_caseD_5:
  if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
    xmlXPathFreeNodeSet(obj->nodesetval);
  }
  (*xmlFree)(obj);
  return;
}

Assistant:

static void
xmlXPathReleaseObject(xmlXPathContextPtr ctxt, xmlXPathObjectPtr obj)
{
#define XP_CACHE_ADD(sl, o) if (sl == NULL) { \
	sl = xmlPointerListCreate(10); if (sl == NULL) goto free_obj; } \
    if (xmlPointerListAddSize(sl, obj, 0) == -1) goto free_obj;

#define XP_CACHE_WANTS(sl, n) ((sl == NULL) || ((sl)->number < n))

    if (obj == NULL)
	return;
    if ((ctxt == NULL) || (ctxt->cache == NULL)) {
	 xmlXPathFreeObject(obj);
    } else {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	switch (obj->type) {
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		if (obj->nodesetval != NULL) {
		    if (obj->boolval) {
			/*
			* It looks like the @boolval is used for
			* evaluation if this an XSLT Result Tree Fragment.
			* TODO: Check if this assumption is correct.
			*/
			obj->type = XPATH_XSLT_TREE; /* just for debugging */
			xmlXPathFreeValueTree(obj->nodesetval);
			obj->nodesetval = NULL;
		    } else if ((obj->nodesetval->nodeMax <= 40) &&
			(XP_CACHE_WANTS(cache->nodesetObjs,
					cache->maxNodeset)))
		    {
			XP_CACHE_ADD(cache->nodesetObjs, obj);
			goto obj_cached;
		    } else {
			xmlXPathFreeNodeSet(obj->nodesetval);
			obj->nodesetval = NULL;
		    }
		}
		break;
	    case XPATH_STRING:
		if (obj->stringval != NULL)
		    xmlFree(obj->stringval);

		if (XP_CACHE_WANTS(cache->stringObjs, cache->maxString)) {
		    XP_CACHE_ADD(cache->stringObjs, obj);
		    goto obj_cached;
		}
		break;
	    case XPATH_BOOLEAN:
		if (XP_CACHE_WANTS(cache->booleanObjs, cache->maxBoolean)) {
		    XP_CACHE_ADD(cache->booleanObjs, obj);
		    goto obj_cached;
		}
		break;
	    case XPATH_NUMBER:
		if (XP_CACHE_WANTS(cache->numberObjs, cache->maxNumber)) {
		    XP_CACHE_ADD(cache->numberObjs, obj);
		    goto obj_cached;
		}
		break;
#ifdef LIBXML_XPTR_LOCS_ENABLED
	    case XPATH_LOCATIONSET:
		if (obj->user != NULL) {
		    xmlXPtrFreeLocationSet(obj->user);
		}
		goto free_obj;
#endif
	    default:
		goto free_obj;
	}

	/*
	* Fallback to adding to the misc-objects slot.
	*/
	if (XP_CACHE_WANTS(cache->miscObjs, cache->maxMisc)) {
	    XP_CACHE_ADD(cache->miscObjs, obj);
	} else
	    goto free_obj;

obj_cached:

#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjUsageReleased(ctxt, obj->type);
#endif

	if (obj->nodesetval != NULL) {
	    xmlNodeSetPtr tmpset = obj->nodesetval;

	    /*
	    * TODO: Due to those nasty ns-nodes, we need to traverse
	    *  the list and free the ns-nodes.
	    * URGENT TODO: Check if it's actually slowing things down.
	    *  Maybe we shouldn't try to preserve the list.
	    */
	    if (tmpset->nodeNr > 1) {
		int i;
		xmlNodePtr node;

		for (i = 0; i < tmpset->nodeNr; i++) {
		    node = tmpset->nodeTab[i];
		    if ((node != NULL) &&
			(node->type == XML_NAMESPACE_DECL))
		    {
			xmlXPathNodeSetFreeNs((xmlNsPtr) node);
		    }
		}
	    } else if (tmpset->nodeNr == 1) {
		if ((tmpset->nodeTab[0] != NULL) &&
		    (tmpset->nodeTab[0]->type == XML_NAMESPACE_DECL))
		    xmlXPathNodeSetFreeNs((xmlNsPtr) tmpset->nodeTab[0]);
	    }
	    tmpset->nodeNr = 0;
	    memset(obj, 0, sizeof(xmlXPathObject));
	    obj->nodesetval = tmpset;
	} else
	    memset(obj, 0, sizeof(xmlXPathObject));

	return;

free_obj:
	/*
	* Cache is full; free the object.
	*/
	if (obj->nodesetval != NULL)
	    xmlXPathFreeNodeSet(obj->nodesetval);
#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjUsageReleased(NULL, obj->type);
#endif
	xmlFree(obj);
    }
    return;
}